

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O3

void __thiscall cmSourceFileLocation::cmSourceFileLocation(cmSourceFileLocation *this)

{
  this->Makefile = (cmMakefile *)0x0;
  this->AmbiguousDirectory = true;
  this->AmbiguousExtension = true;
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  (this->Directory)._M_string_length = 0;
  (this->Directory).field_2._M_local_buf[0] = '\0';
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmSourceFileLocation::cmSourceFileLocation() = default;